

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowObjPS::RowObjPS
          (RowObjPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _i,int _j,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  shared_ptr<soplex::Tolerances> *in_R8;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  PostStep *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_R8,(shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x3e9716);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3e9726);
  PostStep::PostStep(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (shared_ptr<soplex::Tolerances> *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e9757);
  *in_RDI = &PTR__RowObjPS_0089b070;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_ECX;
  return;
}

Assistant:

RowObjPS(const SPxLPBase<R>& lp, int _i, int _j, std::shared_ptr<Tolerances> tols)
         : PostStep("RowObj", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_j(_j)
      {}